

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_list.cpp
# Opt level: O1

void __thiscall duckdb::ColumnList::AddToNameMap(ColumnList *this,ColumnDefinition *col)

{
  undefined8 *puVar1;
  ulong uVar2;
  pointer pcVar3;
  mapped_type mVar4;
  bool bVar5;
  char cVar6;
  iterator iVar7;
  undefined8 *puVar8;
  CatalogException *this_00;
  mapped_type *pmVar9;
  ulong uVar10;
  char cVar11;
  ulong __val;
  string __str_1;
  string base_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  ulong *local_e0;
  uint local_d8;
  undefined4 uStack_d4;
  ulong local_d0 [2];
  undefined8 *local_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 uStack_a8;
  string local_a0;
  ulong *local_80;
  long local_78;
  ulong local_70 [2];
  ColumnList *local_60;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (this->allow_duplicate_names == true) {
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    pcVar3 = (col->name)._M_dataplus._M_p;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_a0,pcVar3,pcVar3 + (col->name)._M_string_length);
    local_58 = (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                *)&this->name_map;
    __val = 1;
    local_60 = this;
    while (iVar7 = ::std::
                   _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   ::find(local_58,&col->name),
          iVar7.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
          ._M_cur != (__node_type *)0x0) {
      local_80 = local_70;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_80,local_a0._M_dataplus._M_p,
                 local_a0._M_dataplus._M_p + local_a0._M_string_length);
      ::std::__cxx11::string::append((char *)&local_80);
      cVar11 = '\x01';
      if (9 < __val) {
        uVar10 = __val;
        cVar6 = '\x04';
        do {
          cVar11 = cVar6;
          if (uVar10 < 100) {
            cVar11 = cVar11 + -2;
            goto LAB_00237109;
          }
          if (uVar10 < 1000) {
            cVar11 = cVar11 + -1;
            goto LAB_00237109;
          }
          if (uVar10 < 10000) goto LAB_00237109;
          bVar5 = 99999 < uVar10;
          uVar10 = uVar10 / 10000;
          cVar6 = cVar11 + '\x04';
        } while (bVar5);
        cVar11 = cVar11 + '\x01';
      }
LAB_00237109:
      local_e0 = local_d0;
      ::std::__cxx11::string::_M_construct((ulong)&local_e0,cVar11);
      ::std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_e0,local_d8,__val);
      uVar10 = 0xf;
      if (local_80 != local_70) {
        uVar10 = local_70[0];
      }
      uVar2 = CONCAT44(uStack_d4,local_d8) + local_78;
      if (uVar10 < uVar2) {
        uVar10 = 0xf;
        if (local_e0 != local_d0) {
          uVar10 = local_d0[0];
        }
        if (uVar10 < uVar2) goto LAB_00237174;
        puVar8 = (undefined8 *)
                 ::std::__cxx11::string::replace((ulong)&local_e0,0,(char *)0x0,(ulong)local_80);
      }
      else {
LAB_00237174:
        puVar8 = (undefined8 *)::std::__cxx11::string::_M_append((char *)&local_80,(ulong)local_e0);
      }
      puVar1 = puVar8 + 2;
      if ((undefined8 *)*puVar8 == puVar1) {
        local_b0 = *puVar1;
        uStack_a8 = puVar8[3];
        local_c0 = &local_b0;
      }
      else {
        local_b0 = *puVar1;
        local_c0 = (undefined8 *)*puVar8;
      }
      local_b8 = puVar8[1];
      *puVar8 = puVar1;
      puVar8[1] = 0;
      *(undefined1 *)puVar1 = 0;
      ::std::__cxx11::string::_M_assign((string *)col);
      if (local_c0 != &local_b0) {
        operator_delete(local_c0);
      }
      if (local_e0 != local_d0) {
        operator_delete(local_e0);
      }
      if (local_80 != local_70) {
        operator_delete(local_80);
      }
      __val = __val + 1;
    }
    this = local_60;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p);
      this = local_60;
    }
  }
  else {
    iVar7 = ::std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                    *)&this->name_map,&col->name);
    if (iVar7.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
        ._M_cur != (__node_type *)0x0) {
      this_00 = (CatalogException *)__cxa_allocate_exception(0x10);
      local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_a0,"Column with name %s already exists!","");
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      pcVar3 = (col->name)._M_dataplus._M_p;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_50,pcVar3,pcVar3 + (col->name)._M_string_length);
      CatalogException::CatalogException<std::__cxx11::string>(this_00,&local_a0,&local_50);
      __cxa_throw(this_00,&CatalogException::typeinfo,::std::runtime_error::~runtime_error);
    }
  }
  mVar4 = col->oid;
  pmVar9 = ::std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)&this->name_map,&col->name);
  *pmVar9 = mVar4;
  return;
}

Assistant:

void ColumnList::AddToNameMap(ColumnDefinition &col) {
	if (allow_duplicate_names) {
		idx_t index = 1;
		string base_name = col.Name();
		while (name_map.find(col.Name()) != name_map.end()) {
			col.SetName(base_name + "_" + to_string(index++));
		}
	} else {
		if (name_map.find(col.Name()) != name_map.end()) {
			throw CatalogException("Column with name %s already exists!", col.Name());
		}
	}
	name_map[col.Name()] = col.Oid();
}